

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playermenu.cpp
# Opt level: O0

bool __thiscall FSliderItem::MenuEvent(FSliderItem *this,int mkey,bool fromcontroller)

{
  int iVar1;
  float fVar2;
  FSoundID local_28;
  FSoundID local_24;
  undefined1 local_1d;
  int local_1c;
  bool fromcontroller_local;
  FSliderItem *pFStack_18;
  int mkey_local;
  FSliderItem *this_local;
  
  local_1d = fromcontroller;
  local_1c = mkey;
  pFStack_18 = this;
  if (mkey == 2) {
    FSoundID::FSoundID(&local_24,"menu/change");
    fVar2 = FFloatCVar::operator_cast_to_float(&snd_menuvolume);
    S_Sound(0x22,&local_24,fVar2,0.0);
    iVar1 = this->mSelection - this->mStep;
    this->mSelection = iVar1;
    if (iVar1 < this->mMinrange) {
      this->mSelection = this->mMinrange;
    }
    this_local._7_1_ = true;
  }
  else if ((mkey == 3) || (mkey == 6)) {
    FSoundID::FSoundID(&local_28,"menu/change");
    fVar2 = FFloatCVar::operator_cast_to_float(&snd_menuvolume);
    S_Sound(0x22,&local_28,fVar2,0.0);
    iVar1 = this->mStep + this->mSelection;
    this->mSelection = iVar1;
    if (this->mMaxrange < iVar1) {
      this->mSelection = this->mMaxrange;
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool FSliderItem::MenuEvent (int mkey, bool fromcontroller)
{
	if (mkey == MKEY_Left)
	{
		S_Sound (CHAN_VOICE | CHAN_UI, "menu/change", snd_menuvolume, ATTN_NONE);
		if ((mSelection -= mStep) < mMinrange) mSelection = mMinrange;
		return true;
	}
	else if (mkey == MKEY_Right || mkey == MKEY_Enter)
	{
		S_Sound (CHAN_VOICE | CHAN_UI, "menu/change", snd_menuvolume, ATTN_NONE);
		if ((mSelection += mStep) > mMaxrange) mSelection = mMaxrange;
		return true;
	}
	return false;
}